

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmSetPropertyCommand::HandleGlobalMode(cmSetPropertyCommand *this)

{
  size_t sVar1;
  cmake *this_00;
  char *value;
  char *value_00;
  string local_40;
  
  sVar1 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    if (this->Remove == false) {
      value = (this->PropertyValue)._M_dataplus._M_p;
    }
    else {
      value = (char *)0x0;
    }
    if (this->AppendMode == true) {
      value_00 = "";
      if (value != (char *)0x0) {
        value_00 = value;
      }
      cmake::AppendProperty(this_00,&this->PropertyName,value_00,this->AppendAsString);
    }
    else {
      cmake::SetProperty(this_00,&this->PropertyName,value);
    }
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"given names for GLOBAL scope.","");
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return sVar1 == 0;
}

Assistant:

bool cmSetPropertyCommand::HandleGlobalMode()
{
  if (!this->Names.empty()) {
    this->SetError("given names for GLOBAL scope.");
    return false;
  }

  // Set or append the property.
  cmake* cm = this->Makefile->GetCMakeInstance();
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = CM_NULLPTR;
  }
  if (this->AppendMode) {
    cm->AppendProperty(name, value ? value : "", this->AppendAsString);
  } else {
    cm->SetProperty(name, value);
  }

  return true;
}